

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<unsigned_long,_true> *ret)

{
  pointer puVar1;
  long lVar2;
  undefined6 in_register_00000032;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  unsigned_long local_30;
  
  (**(code **)(*(long *)this + 0x10))(this,CONCAT62(in_register_00000032,field_id));
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = (**(code **)(*(long *)this + 0x40))(this);
  if (lVar2 != 0) {
    do {
      local_30 = (**(code **)(*(long *)this + 0xa8))(this);
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_30);
      }
      else {
        *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_30;
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (**(code **)(*(long *)this + 0x48))(this);
  puVar1 = (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  (**(code **)(*(long *)this + 0x18))(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}